

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<char16_t>::erase(QPodArrayOps<char16_t> *this,char16_t *b,qsizetype n)

{
  char16_t *__src;
  char16_t *pcVar1;
  char16_t *pcVar2;
  long lVar3;
  
  __src = b + n;
  pcVar2 = (this->super_QArrayDataPointer<char16_t>).ptr;
  lVar3 = (this->super_QArrayDataPointer<char16_t>).size;
  pcVar1 = pcVar2 + lVar3;
  if (__src == pcVar1 || pcVar2 != b) {
    if (__src != pcVar1) {
      memmove(b,__src,(long)pcVar1 - (long)__src);
      lVar3 = (this->super_QArrayDataPointer<char16_t>).size;
    }
  }
  else {
    (this->super_QArrayDataPointer<char16_t>).ptr = __src;
  }
  (this->super_QArrayDataPointer<char16_t>).size = lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }